

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.cpp
# Opt level: O2

Float pbrt::FBm(Point3f p,Vector3f dpdx,Vector3f dpdy,Float omega,int maxOctaves)

{
  undefined8 uVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 in_register_0000003c;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar16 [16];
  float in_XMM2_Dd;
  float fVar17;
  undefined1 auVar18 [64];
  float fVar19;
  float in_XMM4_Dd;
  undefined1 auVar20 [64];
  undefined1 in_register_000013c4 [12];
  Point3f p_00;
  Point3f p_01;
  undefined1 local_58 [16];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  auVar18._4_60_ = dpdx._12_60_;
  auVar18._0_4_ = dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20._4_60_ = dpdy._12_60_;
  auVar20._0_4_ = dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_4_ = dpdx.super_Tuple3<pbrt::Vector3,_float>.x *
                 dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar9._4_4_ = dpdx.super_Tuple3<pbrt::Vector3,_float>.y *
                 dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar9._8_4_ = 0;
  auVar9._12_4_ = in_XMM2_Dd * in_XMM2_Dd;
  auVar16._0_4_ =
       dpdy.super_Tuple3<pbrt::Vector3,_float>.x * dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar16._4_4_ =
       dpdy.super_Tuple3<pbrt::Vector3,_float>.y * dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar16._8_4_ = 0;
  auVar16._12_4_ = in_XMM4_Dd * in_XMM4_Dd;
  auVar7 = vhaddps_avx(auVar9,auVar16);
  auVar9 = vinsertps_avx(auVar18._0_16_,auVar20._0_16_,0x10);
  auVar7 = vshufps_avx(auVar7,auVar7,0xe8);
  auVar10._0_4_ = auVar9._0_4_ * auVar9._0_4_ + auVar7._0_4_;
  auVar10._4_4_ = auVar9._4_4_ * auVar9._4_4_ + auVar7._4_4_;
  auVar10._8_4_ = auVar9._8_4_ * auVar9._8_4_ + auVar7._8_4_;
  auVar10._12_4_ = auVar9._12_4_ * auVar9._12_4_ + auVar7._12_4_;
  auVar7 = vmovshdup_avx(auVar10);
  auVar7 = vmaxss_avx(auVar7,auVar10);
  iVar5 = maxOctaves;
  auVar13._0_4_ = Log2(auVar7._0_4_);
  auVar13._4_60_ = extraout_var;
  auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf000000),0),auVar13._0_16_,ZEXT416(0xbf800000));
  auVar11._0_4_ = (float)maxOctaves;
  auVar11._4_12_ = in_register_000013c4;
  auVar7 = vminss_avx(auVar11,auVar9);
  uVar1 = vcmpss_avx512f(auVar9,ZEXT816(0) << 0x40,1);
  local_58 = ZEXT816(0);
  fVar2 = (float)((uint)!(bool)((byte)uVar1 & 1) * auVar7._0_4_);
  auVar7._0_4_ = fVar2;
  auVar7 = vroundss_avx(auVar7,auVar7,9);
  fVar19 = 1.0;
  uVar3 = (uint)auVar7._0_4_;
  uVar4 = ~((int)uVar3 >> 0x1f) & uVar3;
  fVar17 = fVar19;
  while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, local_48 = p.super_Tuple3<pbrt::Point3,_float>.x,
        uStack_44 = p.super_Tuple3<pbrt::Point3,_float>.y, bVar6) {
    p_00.super_Tuple3<pbrt::Point3,_float>.x = fVar19 * local_48;
    p_00.super_Tuple3<pbrt::Point3,_float>.y = fVar19 * uStack_44;
    p_00.super_Tuple3<pbrt::Point3,_float>.z = fVar19 * p.super_Tuple3<pbrt::Point3,_float>.z;
    auVar14._0_4_ = Noise((pbrt *)CONCAT44(in_register_0000003c,iVar5),p_00);
    auVar14._4_60_ = extraout_var_00;
    fVar19 = fVar19 * 1.99;
    local_58 = vfmadd231ss_fma(local_58,ZEXT416((uint)fVar17),auVar14._0_16_);
    fVar17 = fVar17 * omega;
  }
  auVar12._0_4_ = ((fVar2 - (float)(int)uVar3) + -0.3) / 0.39999998;
  auVar12._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar12);
  uVar1 = vcmpss_avx512f(auVar12,ZEXT816(0) << 0x40,1);
  fVar2 = (float)((uint)!(bool)((byte)uVar1 & 1) * auVar7._0_4_);
  auVar8._4_12_ = auVar7._4_12_;
  auVar8._0_4_ = fVar2;
  auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar8,ZEXT416(0x40400000));
  p_01.super_Tuple3<pbrt::Point3,_float>.x = fVar19 * local_48;
  p_01.super_Tuple3<pbrt::Point3,_float>.y = fVar19 * uStack_44;
  p_01.super_Tuple3<pbrt::Point3,_float>.z = fVar19 * p.super_Tuple3<pbrt::Point3,_float>.z;
  auVar15._0_4_ = Noise((pbrt *)CONCAT44(in_register_0000003c,iVar5),p_01);
  auVar15._4_60_ = extraout_var_01;
  auVar7 = vfmadd213ss_fma(auVar15._0_16_,ZEXT416((uint)(fVar2 * fVar2 * auVar7._0_4_ * fVar17)),
                           ZEXT416((uint)local_58._0_4_));
  return auVar7._0_4_;
}

Assistant:

Float FBm(Point3f p, Vector3f dpdx, Vector3f dpdy, Float omega, int maxOctaves) {
    // Compute number of octaves for antialiased FBm
    Float len2 = std::max(LengthSquared(dpdx), LengthSquared(dpdy));
    Float n = Clamp(-1 - .5f * Log2(len2), 0, maxOctaves);
    int nInt = std::floor(n);

    // Compute sum of octaves of noise for FBm
    Float sum = 0, lambda = 1, o = 1;
    for (int i = 0; i < nInt; ++i) {
        sum += o * Noise(lambda * p);
        lambda *= 1.99f;
        o *= omega;
    }
    Float nPartial = n - nInt;
    sum += o * SmoothStep(nPartial, .3f, .7f) * Noise(lambda * p);

    return sum;
}